

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

bool __thiscall helics::TimeCoordinator::getOptionFlag(TimeCoordinator *this,int optionFlag)

{
  invalid_argument *this_00;
  int in_ESI;
  long in_RDI;
  bool local_1;
  
  if (in_ESI == 1) {
    local_1 = (bool)(*(byte *)(in_RDI + 0x251) & 1);
  }
  else if (in_ESI == 2) {
    local_1 = (bool)((*(byte *)(in_RDI + 0x251) ^ 0xff) & 1);
  }
  else if (in_ESI == 10) {
    local_1 = (bool)(*(byte *)(in_RDI + 0x250) & 1);
  }
  else if (in_ESI == 0xb) {
    local_1 = (bool)(*(byte *)(in_RDI + 0x252) & 1);
  }
  else {
    if (in_ESI != 0x51) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"flag not recognized");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    local_1 = (bool)(*(byte *)(in_RDI + 0x253) & 1);
  }
  return local_1;
}

Assistant:

bool TimeCoordinator::getOptionFlag(int optionFlag) const
{
    switch (optionFlag) {
        case defs::Flags::UNINTERRUPTIBLE:
            return info.uninterruptible;
        case defs::Flags::INTERRUPTIBLE:
            return !info.uninterruptible;
        case defs::Flags::WAIT_FOR_CURRENT_TIME_UPDATE:
            return info.wait_for_current_time_updates;
        case defs::Flags::RESTRICTIVE_TIME_POLICY:
            return info.restrictive_time_policy;
        case defs::Flags::EVENT_TRIGGERED:
            return info.event_triggered;
        default:
            throw(std::invalid_argument("flag not recognized"));
    }
}